

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O3

int messagereceiver_get_link_name(MESSAGE_RECEIVER_HANDLE message_receiver,char **link_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1af;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1af;
    }
    pcVar4 = "NULL message_receiver";
    iVar3 = 0x1ae;
  }
  else {
    iVar1 = link_get_name(message_receiver->link,link_name);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1b6;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1b6;
    }
    pcVar4 = "Getting link name failed";
    iVar3 = 0x1b5;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
            ,"messagereceiver_get_link_name",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int messagereceiver_get_link_name(MESSAGE_RECEIVER_HANDLE message_receiver, const char** link_name)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (link_get_name(message_receiver->link, link_name) != 0)
        {
            LogError("Getting link name failed");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}